

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explorer.hpp
# Opt level: O3

void explorer::Explore<uttt::IBoard,uttt::IBoardReader,uttt::IBoardWriter,24>(string *directory)

{
  pointer pcVar1;
  long *plVar2;
  istream *piVar3;
  pointer pIVar4;
  int offset_00;
  int iVar5;
  int next_level_00;
  initializer_list<uttt::IBoard> __l;
  int next_level;
  int next_offset;
  int offset;
  ifstream in;
  int local_278;
  int local_274;
  int local_270;
  allocator_type local_269;
  undefined1 local_268 [24];
  long lStack_250;
  IBoard local_248;
  string local_228;
  int aiStack_208 [122];
  
  local_278 = 0;
  local_270 = 0;
  local_274 = 0;
  pcVar1 = (directory->_M_dataplus)._M_p;
  local_248._0_8_ = (void *)((long)&local_248 + 0x10U);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,pcVar1,pcVar1 + directory->_M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_248,local_248.micro._M_elems._4_8_,0,'\x01');
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_248);
  pIVar4 = (pointer)(plVar2 + 2);
  if ((pointer)*plVar2 == pIVar4) {
    local_268._16_8_ = *(undefined8 *)pIVar4;
    lStack_250 = plVar2[3];
    local_268._0_8_ = (pointer)(local_268 + 0x10);
  }
  else {
    local_268._16_8_ = *(undefined8 *)pIVar4;
    local_268._0_8_ = (pointer)*plVar2;
  }
  local_268._8_8_ = plVar2[1];
  *plVar2 = (long)pIVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::ifstream::ifstream(&local_228,(string *)local_268,_S_in);
  if ((pointer)local_268._0_8_ != (pointer)(local_268 + 0x10)) {
    operator_delete((void *)local_268._0_8_);
  }
  if ((void *)local_248._0_8_ != (void *)((long)&local_248 + 0x10U)) {
    operator_delete((void *)local_248._0_8_);
  }
  if (*(int *)((long)aiStack_208 + *(long *)(local_228._M_dataplus._M_p + -0x18)) == 0) {
    piVar3 = (istream *)std::istream::operator>>((istream *)&local_228,&local_278);
    piVar3 = (istream *)std::istream::operator>>(piVar3,&local_270);
    std::istream::operator>>(piVar3,&local_274);
    std::ifstream::~ifstream(&local_228);
    iVar5 = local_274;
    next_level_00 = local_278;
    offset_00 = local_270;
  }
  else {
    std::ifstream::~ifstream(&local_228);
    pcVar1 = (directory->_M_dataplus)._M_p;
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,pcVar1,pcVar1 + directory->_M_string_length);
    std::__cxx11::string::append((char *)&local_228);
    uttt::IBoard::IBoard(&local_248);
    __l._M_len = 1;
    __l._M_array = &local_248;
    std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::vector
              ((vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)local_268,__l,&local_269);
    DumpToFile<uttt::IBoard,uttt::IBoardWriter>
              (&local_228,(vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)local_268);
    if ((pointer)local_268._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_268._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p);
    }
    local_278 = 1;
    local_270 = 0;
    local_274 = 0;
    WriteLevelsFile((explorer *)(directory->_M_dataplus)._M_p,(string *)directory->_M_string_length,
                    1,0,0);
    iVar5 = 0;
    next_level_00 = 1;
    offset_00 = 0;
  }
  ExploreLevel<uttt::IBoard,uttt::IBoardReader,uttt::IBoardWriter,24>
            (directory,next_level_00,offset_00,iVar5);
  iVar5 = local_278;
  do {
    iVar5 = iVar5 + 1;
    ExploreLevel<uttt::IBoard,uttt::IBoardReader,uttt::IBoardWriter,24>(directory,iVar5,0,0);
  } while( true );
}

Assistant:

void
Explore(const std::string &directory)
{
    int next_level = 0, offset = 0, next_offset = 0;
    if (!ReadLevelsFile(directory, next_level, offset, next_offset))
    {
        DumpToFile<IGame, Writer>(directory + "/0_0", {{}});
        next_level = 1, offset = 0, next_offset = 0;
        WriteLevelsFile(directory, next_level, offset, next_offset);
    }

    ExploreLevel<IGame, Reader, Writer, Size>(directory, next_level, offset, next_offset);
    for (int level = next_level + 1; ; ++level)
        ExploreLevel<IGame, Reader, Writer, Size>(directory, level, 0, 0);
}